

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

_Bool borg_follow_kill_aux(wchar_t i,wchar_t y,wchar_t x)

{
  ushort uVar1;
  ushort uVar2;
  monster_race *pmVar3;
  _Bool _Var4;
  wchar_t wVar5;
  loc_conflict grid2;
  
  pmVar3 = r_info;
  uVar1 = borg_kills[i].r_idx;
  grid2 = loc(x,y);
  wVar5 = distance(borg.c,grid2);
  if ((wVar5 <= (int)(uint)z_info->max_sight) && (uVar2 = borg_grids[y][x].info, (uVar2 & 8) != 0))
  {
    if ((uVar2 & 0x20) != 0) {
      if ((uVar2 & 0x12) != 0) {
        if (borg.trait[0x33] != 0) {
          return true;
        }
        if (borg.see_inv != 0) {
          return true;
        }
        _Var4 = flag_has_dbg(pmVar3[uVar1].flags,0xb,0x28,"r_ptr->flags","RF_INVISIBLE");
        if (!_Var4) {
          return true;
        }
      }
      if ((wVar5 <= borg.trait[0x34]) &&
         (_Var4 = flag_has_dbg(r_info->flags,0xb,0x29,"r_info->flags","RF_COLD_BLOOD"), !_Var4)) {
        return true;
      }
    }
    if ((borg.trait[0x25] != 0) &&
       (_Var4 = flag_has_dbg(r_info->flags,0xb,0x2a,"r_info->flags","RF_EMPTY_MIND"), !_Var4)) {
      _Var4 = flag_has_dbg(r_info->flags,0xb,0x2b,"r_info->flags","RF_WEIRD_MIND");
      return !_Var4;
    }
  }
  return false;
}

Assistant:

static bool borg_follow_kill_aux(int i, int y, int x)
{
    int d;

    borg_grid *ag;

    borg_kill *kill            = &borg_kills[i];

    struct monster_race *r_ptr = &r_info[kill->r_idx];

    /* Distance to player */
    d = distance(borg.c, loc(x, y));

    /* Too far away */
    if (d > z_info->max_sight)
        return false;

    /* Access the grid */
    ag = &borg_grids[y][x];

    /* Not on-screen */
    if (!(ag->info & BORG_OKAY))
        return false;

    /* Line of sight */
    if (ag->info & BORG_VIEW) {
        /* Use "illumination" */
        if (ag->info & (BORG_LIGHT | BORG_GLOW)) {
            /* We can see invisible */
            if (borg.trait[BI_SINV] || borg.see_inv)
                return true;

            /* Monster is not invisible */
            if (!(rf_has(r_ptr->flags, RF_INVISIBLE)))
                return true;
        }

        /* Use "infravision" */
        if (d <= borg.trait[BI_INFRA]) {
            /* Infravision works on "warm" creatures */
            if (!(rf_has(r_info->flags, RF_COLD_BLOOD)))
                return true;
        }
    }

    /* Telepathy requires "telepathy" */
    if (borg.trait[BI_ESP]) {
        /* Telepathy fails on "strange" monsters */
        if (rf_has(r_info->flags, RF_EMPTY_MIND))
            return false;
        if (rf_has(r_info->flags, RF_WEIRD_MIND))
            return false;

        /* Success */
        return true;
    }

    /* Nope */
    return false;
}